

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

double calAngle(double tangentX,double tangentY)

{
  int __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar1;
  double local_30;
  double angle;
  double tol;
  double param;
  double tangentY_local;
  double tangentX_local;
  
  __x = 10;
  local_30 = std::pow<int,int>(10,-8);
  std::abs(__x);
  if ((local_30 <= extraout_XMM0_Qa) || (std::abs(__x), local_30 <= extraout_XMM0_Qa_00)) {
    std::abs(__x);
    if ((local_30 <= extraout_XMM0_Qa_01) || (tangentY <= 99999.0)) {
      std::abs(__x);
      if ((local_30 <= extraout_XMM0_Qa_02) || (-99999.0 <= tangentY)) {
        dVar1 = atan(tangentY / tangentX);
        local_30 = (dVar1 * 180.0) / 3.14159265;
        if ((0.0 <= tangentX) || (0.0 <= tangentY)) {
          if ((tangentX < 0.0) && (0.0 < tangentY)) {
            local_30 = local_30 + 180.0;
          }
        }
        else {
          local_30 = local_30 + 180.0;
        }
      }
      else {
        local_30 = 270.0;
      }
    }
    else {
      local_30 = 90.0;
    }
  }
  if (local_30 < 0.0) {
    local_30 = local_30 + 360.0;
  }
  return local_30;
}

Assistant:

double calAngle(double tangentX, double tangentY)
{
    double param = tangentY / double(tangentX);
    double tol = pow(10,-8);
    double angle;
    if(abs(tangentX - 0) < tol && abs(tangentY - 0) < tol)
        angle = tol;
    else if(abs(tangentX - 0) < tol && tangentY > 99999)
        angle = 90;
    else if(abs(tangentX - 0) < tol && tangentY < -99999)
        angle = 270;
    else{
        angle = atan(param) * 180 / PI;
        if(tangentX < 0 && tangentY < 0)
            angle += 180;
        else if(tangentX < 0 && tangentY > 0)
            angle += 180;
    }
    if(angle < 0)
        angle += 360;
    return angle;
}